

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O3

void __thiscall
ManifestFile::GetInstanceExtensionProperties
          (ManifestFile *this,
          vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *props)

{
  pointer *ppXVar1;
  pointer pEVar2;
  XrExtensionProperties *pXVar3;
  iterator __position;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  XrExtensionProperties *pXVar8;
  long lVar9;
  XrExtensionProperties *pXVar10;
  const_iterator __begin1;
  pointer pEVar11;
  long lVar12;
  const_iterator __end1;
  XrExtensionProperties local_c8;
  
  pEVar11 = (this->_instance_extensions).
            super__Vector_base<ExtensionListing,_std::allocator<ExtensionListing>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar2 = (this->_instance_extensions).
           super__Vector_base<ExtensionListing,_std::allocator<ExtensionListing>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pEVar11 == pEVar2) {
      return;
    }
    pXVar10 = (props->
              super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pXVar3 = (props->
             super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar12 = (long)pXVar3 - (long)pXVar10;
    lVar9 = (lVar12 >> 3) * -0x79435e50d79435e5 >> 2;
    if (0 < lVar9) {
      lVar9 = lVar9 + 1;
      lVar4 = 0;
      do {
        lVar7 = lVar4;
        iVar5 = std::__cxx11::string::compare((char *)pEVar11);
        if (iVar5 == 0) {
          pXVar8 = (XrExtensionProperties *)(pXVar10->extensionName + lVar7 + -0x10);
          goto LAB_0011525d;
        }
        iVar5 = std::__cxx11::string::compare((char *)pEVar11);
        if (iVar5 == 0) {
          pXVar8 = (XrExtensionProperties *)(pXVar10[1].extensionName + lVar7 + -0x10);
          goto LAB_0011525d;
        }
        iVar5 = std::__cxx11::string::compare((char *)pEVar11);
        if (iVar5 == 0) {
          pXVar8 = (XrExtensionProperties *)(pXVar10[2].extensionName + lVar7 + -0x10);
          goto LAB_0011525d;
        }
        iVar5 = std::__cxx11::string::compare((char *)pEVar11);
        if (iVar5 == 0) {
          pXVar8 = (XrExtensionProperties *)(pXVar10[3].extensionName + lVar7 + -0x10);
          goto LAB_0011525d;
        }
        lVar9 = lVar9 + -1;
        lVar4 = lVar7 + 0x260;
      } while (1 < lVar9);
      lVar12 = lVar12 - (lVar7 + 0x260);
      pXVar10 = (XrExtensionProperties *)(pXVar10[4].extensionName + lVar7 + -0x10);
    }
    lVar9 = (lVar12 >> 3) * -0x79435e50d79435e5;
    if (lVar9 == 1) {
LAB_00115230:
      iVar5 = std::__cxx11::string::compare((char *)pEVar11);
      pXVar8 = pXVar3;
      if (iVar5 == 0) {
        pXVar8 = pXVar10;
      }
    }
    else if (lVar9 == 2) {
LAB_00115212:
      iVar5 = std::__cxx11::string::compare((char *)pEVar11);
      pXVar8 = pXVar10;
      if (iVar5 != 0) {
        pXVar10 = pXVar10 + 1;
        goto LAB_00115230;
      }
    }
    else {
      pXVar8 = pXVar3;
      if ((lVar9 == 3) &&
         (iVar5 = std::__cxx11::string::compare((char *)pEVar11), pXVar8 = pXVar10, iVar5 != 0)) {
        pXVar10 = pXVar10 + 1;
        goto LAB_00115212;
      }
    }
LAB_0011525d:
    __position._M_current =
         (props->super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (pXVar8 == __position._M_current) {
      memset(&local_c8,0,0x98);
      local_c8.type = XR_TYPE_EXTENSION_PROPERTIES;
      strncpy(local_c8.extensionName,(pEVar11->name)._M_dataplus._M_p,0x7f);
      local_c8.extensionName[0x7f] = '\0';
      local_c8.extensionVersion = pEVar11->extension_version;
      if (pXVar8 == (props->
                    super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<XrExtensionProperties,std::allocator<XrExtensionProperties>>::
        _M_realloc_insert<XrExtensionProperties_const&>
                  ((vector<XrExtensionProperties,std::allocator<XrExtensionProperties>> *)props,
                   __position,&local_c8);
      }
      else {
        memcpy(__position._M_current,&local_c8,0x98);
        ppXVar1 = &(props->
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppXVar1 = *ppXVar1 + 1;
      }
    }
    else {
      uVar6 = pEVar11->extension_version;
      if (pEVar11->extension_version < pXVar8->extensionVersion) {
        uVar6 = pXVar8->extensionVersion;
      }
      pXVar8->extensionVersion = uVar6;
    }
    pEVar11 = pEVar11 + 1;
  } while( true );
}

Assistant:

void ManifestFile::GetInstanceExtensionProperties(std::vector<XrExtensionProperties> &props) {
    GetExtensionProperties(_instance_extensions, props);
}